

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_1::initialize
               (Header *header,Box2i *displayWindow,Box2i *dataWindow,float pixelAspectRatio,
               V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
               Compression compression)

{
  bool bVar1;
  ArgExc *this;
  TypedAttribute<Imf_3_4::ChannelList> *in_RDI;
  float in_XMM0_Da;
  stringstream _iex_throw_s;
  Attribute *in_stack_000002d0;
  char *in_stack_000002d8;
  undefined4 in_stack_000002e0;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffce8;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *in_stack_fffffffffffffcf0;
  stringstream local_200 [16];
  ostream local_1f0 [468];
  float local_1c;
  TypedAttribute<Imf_3_4::ChannelList> *local_8;
  
  local_1c = in_XMM0_Da;
  local_8 = in_RDI;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::TypedAttribute
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                 in_stack_000002d0);
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)0x1d6271);
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::TypedAttribute
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                 in_stack_000002d0);
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)0x1d62bd);
  bVar1 = std::isnormal(local_1c);
  if ((bVar1) && (0.0 <= local_1c)) {
    TypedAttribute<float>::TypedAttribute
              ((TypedAttribute<float> *)in_stack_fffffffffffffcf0,(float *)in_stack_fffffffffffffce8
              );
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)0x1d642b);
    TypedAttribute<Imath_3_2::Vec2<float>_>::TypedAttribute
              ((TypedAttribute<Imath_3_2::Vec2<float>_> *)in_stack_fffffffffffffcf0,
               (Vec2<float> *)in_stack_fffffffffffffce8);
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<Imath_3_2::Vec2<float>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_2::Vec2<float>_> *)0x1d6477);
    TypedAttribute<float>::TypedAttribute
              ((TypedAttribute<float> *)in_stack_fffffffffffffcf0,(float *)in_stack_fffffffffffffce8
              );
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)0x1d64c3);
    TypedAttribute<Imf_3_4::LineOrder>::TypedAttribute
              ((TypedAttribute<Imf_3_4::LineOrder> *)in_stack_fffffffffffffcf0,
               (LineOrder *)in_stack_fffffffffffffce8);
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<Imf_3_4::LineOrder>::~TypedAttribute
              ((TypedAttribute<Imf_3_4::LineOrder> *)0x1d650f);
    TypedAttribute<Imf_3_4::Compression>::TypedAttribute
              ((TypedAttribute<Imf_3_4::Compression> *)in_stack_fffffffffffffcf0,
               (Compression *)in_stack_fffffffffffffce8);
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<Imf_3_4::Compression>::~TypedAttribute
              ((TypedAttribute<Imf_3_4::Compression> *)0x1d655b);
    TypedAttribute<Imf_3_4::ChannelList>::TypedAttribute(local_8);
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<Imf_3_4::ChannelList>::~TypedAttribute(local_8);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_200);
  std::operator<<(local_1f0,"Invalid pixel aspect ratio");
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this,local_200);
  __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
initialize (
    Header&      header,
    const Box2i& displayWindow,
    const Box2i& dataWindow,
    float        pixelAspectRatio,
    const V2f&   screenWindowCenter,
    float        screenWindowWidth,
    LineOrder    lineOrder,
    Compression  compression)
{
    header.insert ("displayWindow", Box2iAttribute (displayWindow));
    header.insert ("dataWindow", Box2iAttribute (dataWindow));
    if (!std::isnormal (pixelAspectRatio) || pixelAspectRatio < 0.f)
        THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel aspect ratio");
    header.insert ("pixelAspectRatio", FloatAttribute (pixelAspectRatio));
    header.insert ("screenWindowCenter", V2fAttribute (screenWindowCenter));
    header.insert ("screenWindowWidth", FloatAttribute (screenWindowWidth));
    header.insert ("lineOrder", LineOrderAttribute (lineOrder));
    header.insert ("compression", CompressionAttribute (compression));
    header.insert ("channels", ChannelListAttribute ());
}